

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut.hpp
# Opt level: O2

void __thiscall
boost::ext::ut::v1_1_8::reporter<boost::ext::ut::v1_1_8::printer>::on
          (reporter<boost::ext::ut::v1_1_8::printer> *this)

{
  string_view *t;
  undefined1 *puVar1;
  ostream *poVar2;
  printer *ppVar3;
  printer *ppVar4;
  string local_50 [32];
  
  if (on::once) {
    on::once = false;
    if ((this->asserts_).fail == 0 && (this->tests_).fail == 0) {
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(this->printer_).colors_.pass._M_str,
                          (this->printer_).colors_.pass._M_len);
      poVar2 = std::operator<<(poVar2,"All tests passed");
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,(this->printer_).colors_.none._M_str,
                          (this->printer_).colors_.none._M_len);
      poVar2 = std::operator<<(poVar2," (");
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      poVar2 = std::operator<<(poVar2," asserts in ");
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::operator<<(poVar2," tests)\n");
      if ((this->tests_).skip != 0) {
        poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::operator<<(poVar2," tests skipped\n");
      }
      std::ostream::flush();
      return;
    }
    ppVar4 = &this->printer_;
    puVar1 = &(this->printer_).field_0x40;
    std::operator<<((ostream *)puVar1,
                    "\n===============================================================================\n"
                   );
    std::operator<<((ostream *)puVar1,"tests:   ");
    std::ostream::_M_insert<unsigned_long>((ulong)puVar1);
    std::operator<<((ostream *)puVar1," | ");
    t = &(this->printer_).colors_.fail;
    ppVar3 = printer::operator<<(ppVar4,t);
    ppVar3 = printer::operator<<(ppVar3,&(this->tests_).fail);
    std::operator<<((ostream *)&ppVar3->field_0x40," failed");
    ppVar3 = printer::operator<<(ppVar3,(basic_string_view<char,_std::char_traits<char>_> *)ppVar4);
    puVar1 = &ppVar3->field_0x40;
    std::operator<<((ostream *)puVar1,'\n');
    std::operator<<((ostream *)puVar1,"asserts: ");
    std::ostream::_M_insert<unsigned_long>((ulong)puVar1);
    std::operator<<((ostream *)puVar1," | ");
    ppVar3 = printer::operator<<(ppVar3,&(this->asserts_).pass);
    std::operator<<((ostream *)&ppVar3->field_0x40," passed");
    std::operator<<((ostream *)&ppVar3->field_0x40," | ");
    ppVar3 = printer::operator<<(ppVar3,t);
    ppVar3 = printer::operator<<(ppVar3,&(this->asserts_).fail);
    std::operator<<((ostream *)&ppVar3->field_0x40," failed");
    ppVar4 = printer::operator<<(ppVar3,(basic_string_view<char,_std::char_traits<char>_> *)ppVar4);
    std::operator<<((ostream *)&ppVar4->field_0x40,'\n');
    std::__cxx11::stringbuf::str();
    poVar2 = std::operator<<((ostream *)&std::cerr,local_50);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string(local_50);
  }
  return;
}

Assistant:

auto on(events::summary) -> void {
      if (static auto once = true; once) {
        once = false;
        if (tests_.fail or asserts_.fail) {
          printer_
              << "\n========================================================"
                 "=======================\n"
              << "tests:   " << (tests_.pass + tests_.fail) << " | "
              << printer_.colors().fail << tests_.fail << " failed"
              << printer_.colors().none << '\n'
              << "asserts: " << (asserts_.pass + asserts_.fail) << " | "
              << asserts_.pass << " passed"
              << " | " << printer_.colors().fail << asserts_.fail << " failed"
              << printer_.colors().none << '\n';
          std::cerr << printer_.str() << std::endl;
        } else {
          std::cout << printer_.colors().pass << "All tests passed"
                    << printer_.colors().none << " (" << asserts_.pass
                    << " asserts in " << tests_.pass << " tests)\n";

          if (tests_.skip) {
            std::cout << tests_.skip << " tests skipped\n";
          }

          std::cout.flush();
        }
      }
    }